

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O2

bool __thiscall DFraggleThinker::wait_finished(DFraggleThinker *this,DRunningScript *script)

{
  int iVar1;
  sector_t *psVar2;
  uint uVar3;
  DRunningScript *pDVar4;
  DFsScript *pDVar5;
  DSectorEffect *pDVar6;
  bool bVar7;
  FSectorTagIterator itr;
  FSectorTagIterator local_30;
  
  switch(script->wait_type) {
  case 1:
    iVar1 = script->wait_data;
    script->wait_data = iVar1 + -1;
    bVar7 = iVar1 < 2;
    break;
  case 2:
    local_30.searchtag = script->wait_data;
    if (local_30.searchtag == 0) {
      local_30.start = 0;
    }
    else {
      local_30.start = tagManager.TagHashFirst[(byte)local_30.searchtag];
    }
    while (uVar3 = FSectorTagIterator::Next(&local_30), psVar2 = sectors, -1 < (int)uVar3) {
      pDVar6 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&sectors[uVar3].floordata);
      if (((pDVar6 != (DSectorEffect *)0x0) ||
          (pDVar6 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&psVar2[uVar3].ceilingdata),
          pDVar6 != (DSectorEffect *)0x0)) ||
         (pDVar6 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&psVar2[uVar3].lightingdata),
         pDVar6 != (DSectorEffect *)0x0)) break;
    }
    bVar7 = SUB41(uVar3 >> 0x1f,0);
    break;
  case 3:
    pDVar4 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&this->RunningScripts);
    do {
      pDVar4 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&pDVar4->next);
      bVar7 = pDVar4 == (DRunningScript *)0x0;
      if (bVar7) {
        return bVar7;
      }
    } while ((pDVar4 == script) ||
            (pDVar5 = GC::ReadBarrier<DFsScript>((DFsScript **)&pDVar4->script),
            pDVar5->scriptnum != script->wait_data));
    break;
  case 4:
    pDVar4 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&this->RunningScripts);
    do {
      pDVar4 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&pDVar4->next);
      bVar7 = pDVar4 != (DRunningScript *)0x0;
      if (pDVar4 == (DRunningScript *)0x0) {
        return bVar7;
      }
    } while ((pDVar4 == script) ||
            (pDVar5 = GC::ReadBarrier<DFsScript>((DFsScript **)&pDVar4->script),
            pDVar5->scriptnum != script->wait_data));
    break;
  default:
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool DFraggleThinker::wait_finished(DRunningScript *script)
{
	switch(script->wait_type)
    {
    case wt_none: return true;        // uh? hehe
    case wt_scriptwait:               // waiting for script to finish
		{
			DRunningScript *current;
			for(current = RunningScripts->next; current; current = current->next)
			{
				if(current == script) continue;  // ignore this script
				if(current->script->scriptnum == script->wait_data)
					return false;        // script still running
			}
			return true;        // can continue now
		}
		
    case wt_delay:                          // just count down
		{
			return --script->wait_data <= 0;
		}
		
    case wt_tagwait:
		{
			int secnum;
			FSectorTagIterator itr(script->wait_data);
			while ((secnum = itr.Next()) >= 0)
			{
				sector_t *sec = &sectors[secnum];
				if(sec->floordata || sec->ceilingdata || sec->lightingdata)
					return false;        // not finished
			}
			return true;
		}
		
    case wt_scriptwaitpre: // haleyjd - wait for script to start
		{
			DRunningScript *current;
			for(current = RunningScripts->next; current; current=current->next)
			{
				if(current == script) continue;  // ignore this script
				if(current->script->scriptnum == script->wait_data)
					return true;        // script is now running
			}
			return false; // no running instances found
		}
		
    default: return true;
    }
	
	return false;
}